

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::Descriptor::GetLocationPath
          (Descriptor *this,vector<int,_std::allocator<int>_> *output)

{
  long *plVar1;
  iterator iVar2;
  int local_14;
  
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_00355377;
    *iVar2._M_current = 4;
  }
  else {
    GetLocationPath(*(Descriptor **)(this + 0x18),output);
    iVar2._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_00355377:
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,&local_14);
      goto LAB_00355384;
    }
    *iVar2._M_current = 3;
  }
  (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = iVar2._M_current + 1;
LAB_00355384:
  plVar1 = (long *)(*(long *)(this + 0x18) + 0x38);
  if (*(long *)(this + 0x18) == 0) {
    plVar1 = (long *)(*(long *)(this + 0x10) + 0x58);
  }
  iVar2._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = (int)((ulong)((long)this - *plVar1) >> 3) * -0xf0f0f0f;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void Descriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kNestedTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kMessageTypeFieldNumber);
    output->push_back(index());
  }
}